

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O0

int Constant::Util::getint(char **p)

{
  int iVar1;
  long *in_RDI;
  int ret;
  undefined4 local_c;
  
  while( true ) {
    iVar1 = isdigit((int)*(char *)*in_RDI);
    if (iVar1 != 0) break;
    *in_RDI = *in_RDI + 1;
  }
  local_c = 0;
  while( true ) {
    iVar1 = isdigit((int)*(char *)*in_RDI);
    if (iVar1 == 0) break;
    local_c = local_c * 10 + (int)*(char *)*in_RDI + -0x30;
    *in_RDI = *in_RDI + 1;
  }
  return local_c;
}

Assistant:

int Constant::Util::getint(char *&p) {
    while (!isdigit(*p))
        p++;
    int ret = 0;
    while (isdigit(*p)) {
        ret = 10*ret + *p - '0';
        p++;
    }
    return ret;
}